

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-reader.c
# Opt level: O0

void labpack_reader_init(labpack_reader_t *reader)

{
  mpack_reader_t *pmVar1;
  labpack_reader_t *reader_local;
  
  if (reader != (labpack_reader_t *)0x0) {
    pmVar1 = (mpack_reader_t *)malloc(0x50);
    reader->decoder = pmVar1;
    if (reader->decoder == (mpack_reader_t *)0x0) {
      reader->status = LABPACK_STATUS_ERROR_OUT_OF_MEMORY;
      reader->status_message = "Not enough memory available to create internal decoder";
    }
    else {
      labpack_reader_reset_status(reader);
    }
    return;
  }
  __assert_fail("reader",
                "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/src/labpack-reader.c"
                ,0x46,"void labpack_reader_init(labpack_reader_t *)");
}

Assistant:

static void
labpack_reader_init(labpack_reader_t* reader)
{
    assert(reader);
    reader->decoder = malloc(sizeof(mpack_reader_t));
    if (reader->decoder) {
        labpack_reader_reset_status(reader);
    } else {
        reader->status = LABPACK_STATUS_ERROR_OUT_OF_MEMORY;
        reader->status_message = "Not enough memory available to create internal decoder";
    }
}